

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::
DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::iterate
          (TestStatus *__return_storage_ptr__,
          DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this)

{
  int iVar1;
  DeviceInterface *pDVar2;
  VkCommandBuffer_s *pVVar3;
  deUint64 dVar4;
  VkOffset3D offset_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  qpTestResult code;
  VkDevice pVVar5;
  VkDevice pVVar6;
  bool bVar7;
  VkResult VVar8;
  uint uVar9;
  TestContext *this_00;
  VkQueue queue_00;
  VkPhysicalDeviceFeatures *__src;
  Buffer *this_01;
  VkCommandBuffer_s **ppVVar10;
  Handle<(vk::HandleType)18> *pHVar11;
  size_type sVar12;
  Handle<(vk::HandleType)8> *pHVar13;
  Allocation *pAVar14;
  VkDeviceMemory VVar15;
  VkDeviceSize VVar16;
  void *pvVar17;
  reference src;
  reference pvVar18;
  pointer pVVar19;
  reference pvVar20;
  Image *this_02;
  Allocator *allocator_00;
  char *__s;
  MovePtr *pMVar21;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  undefined4 uVar22;
  undefined4 uVar23;
  allocator<char> local_559;
  string local_558;
  ConstPixelBufferAccess local_538;
  qpTestResult local_50c;
  void *pvStack_508;
  qpTestResult res;
  deInt32 local_500;
  undefined1 local_4f8 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  uint local_494;
  deUint32 vertexIndex;
  deUint32 idx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_458;
  __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_450;
  const_iterator cmd;
  PixelBufferAccess local_438;
  TextureFormat local_410;
  undefined1 local_408 [8];
  TextureLevel refImage;
  undefined8 uStack_3d8;
  VkSubmitInfo submitInfo;
  uint local_37c;
  deUint32 offset;
  deUint32 cmdIdx;
  VkMemoryRequirements local_348;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_330;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_320;
  undefined1 local_310 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indexAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_2e0;
  undefined1 local_2c0 [8];
  VkBufferCreateInfo bufferCreateInfo;
  Move<vk::Handle<(vk::HandleType)8>_> indexBuffer;
  deUint32 bufferSize;
  VkMemoryRequirements local_238;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_220;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_210;
  Move<vk::Handle<(vk::HandleType)8>_> local_200;
  RefData<vk::Handle<(vk::HandleType)8>_> local_1e0;
  undefined1 local_1c0 [8];
  VkBufferCreateInfo indirectCreateInfo;
  VkDeviceSize indirectInfoSize;
  undefined1 local_170 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indirectAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> indirectBuffer;
  deUint64 local_138;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkPhysicalDeviceFeatures features;
  Allocator *allocator;
  VkQueue queue;
  VkDevice pVStack_30;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  TestLog *log;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this_local;
  
  log = (TestLog *)this;
  this_local = (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *)
               __return_storage_ptr__;
  this_00 = Context::getTestContext((this->super_DrawTestInstanceBase).super_TestInstance.m_context)
  ;
  vk = (DeviceInterface *)tcu::TestContext::getLog(this_00);
  vkDevice = (VkDevice)
             Context::getDeviceInterface
                       ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  pVStack_30 = Context::getDevice((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue._4_4_ = Context::getUniversalQueueFamilyIndex
                          ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  features._212_8_ =
       Context::getDefaultAllocator((this->super_DrawTestInstanceBase).super_TestInstance.m_context)
  ;
  __src = Context::getDeviceFeatures
                    ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  memcpy((void *)((long)&vertexBufferOffset + 4),__src,0xdc);
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestInstanceBase).m_vertexBuffer);
  local_138 = (deUint64)Draw::Buffer::object(this_01);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  this_03 = &(this->super_DrawTestInstanceBase).m_cmdBuffer;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar10;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_DrawTestInstanceBase).m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,pHVar11->m_internal);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x58])(pDVar2,*ppVVar10,0,1,&local_138,&vertexBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170);
  sVar12 = std::
           vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ::size(&(this->m_data).commands);
  indirectCreateInfo._16_8_ = sVar12 * 0x14;
  local_1c0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  indirectCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  indirectCreateInfo._4_4_ = 0;
  indirectCreateInfo.pNext._0_4_ = 0;
  indirectCreateInfo.size._0_4_ = 0x100;
  indirectCreateInfo.size._4_4_ = 0;
  indirectCreateInfo.usage = 1;
  indirectCreateInfo._40_8_ = (long)&queue + 4;
  indirectCreateInfo.pQueueFamilyIndices = (deUint32 *)indirectCreateInfo._16_8_;
  ::vk::createBuffer(&local_200,(DeviceInterface *)vkDevice,pVStack_30,
                     (VkBufferCreateInfo *)local_1c0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e0,(Move *)&local_200);
  uVar22 = SUB84(local_1e0.deleter.m_deviceIface,0);
  uVar23 = (undefined4)((ulong)local_1e0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_deviceIface._0_4_ = uVar22;
  data_01.object.m_internal = local_1e0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = uVar23;
  data_01.deleter.m_device._0_4_ = (int)local_1e0.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_1e0.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_1e0.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_200);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_30;
  pMVar21 = (MovePtr *)features._212_8_;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &indirectAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  ::vk::getBufferMemoryRequirements
            (&local_238,(DeviceInterface *)pVVar6,pVVar5,(VkBuffer)pHVar13->m_internal);
  (**(code **)(*(long *)pMVar21 + 0x18))
            (&local_220,pMVar21,&local_238,::vk::MemoryRequirement::HostVisible);
  local_210 = de::details::MovePtr::operator_cast_to_PtrData(&local_220,pMVar21);
  data._8_4_ = uVar22;
  data.ptr = (Allocation *)local_1e0.object.m_internal;
  data._12_4_ = uVar23;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_220);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_30;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &indirectAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  dVar4 = pHVar13->m_internal;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0x60))(pVVar6,pVVar5,dVar4,VVar15.m_internal,VVar16);
  ::vk::checkResult(VVar8,
                    "vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x42d);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170)
  ;
  pvVar17 = ::vk::Allocation::getHostPtr(pAVar14);
  src = std::
        vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
        ::operator[](&(this->m_data).commands,0);
  ::deMemcpy(pvVar17,src,(size_t)indirectCreateInfo.pQueueFamilyIndices);
  pVVar5 = pVStack_30;
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange
            (pDVar2,pVVar5,VVar15,VVar16,(VkDeviceSize)indirectCreateInfo.pQueueFamilyIndices);
  sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     (&(this->m_data).super_IndexedParamsBase.indexes);
  uVar9 = (int)sVar12 << 2;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferCreateInfo.pQueueFamilyIndices);
  local_2c0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext._0_4_ = 0;
  bufferCreateInfo._16_8_ = ZEXT48(uVar9);
  bufferCreateInfo.size._0_4_ = 0x40;
  bufferCreateInfo.size._4_4_ = 0;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo._40_8_ = (long)&queue + 4;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                     &indexAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8,(DeviceInterface *)vkDevice,pVStack_30,
                     (VkBufferCreateInfo *)local_2c0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2e0,
             (Move *)&indexAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar22 = SUB84(local_2e0.deleter.m_deviceIface,0);
  uVar23 = (undefined4)((ulong)local_2e0.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_deviceIface._0_4_ = uVar22;
  data_02.object.m_internal = local_2e0.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = uVar23;
  data_02.deleter.m_device._0_4_ = (int)local_2e0.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_2e0.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_2e0.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_2e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferCreateInfo.pQueueFamilyIndices,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indexAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_30;
  pMVar21 = (MovePtr *)features._212_8_;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferCreateInfo.pQueueFamilyIndices);
  ::vk::getBufferMemoryRequirements
            (&local_348,(DeviceInterface *)pVVar6,pVVar5,(VkBuffer)pHVar13->m_internal);
  (**(code **)(*(long *)pMVar21 + 0x18))
            (&local_330,pMVar21,&local_348,::vk::MemoryRequirement::HostVisible);
  local_320 = de::details::MovePtr::operator_cast_to_PtrData(&local_330,pMVar21);
  data_00._8_4_ = uVar22;
  data_00.ptr = (Allocation *)local_2e0.object.m_internal;
  data_00._12_4_ = uVar23;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_330);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_30;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferCreateInfo.pQueueFamilyIndices);
  dVar4 = pHVar13->m_internal;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0x60))(pVVar6,pVVar5,dVar4,VVar15.m_internal,VVar16);
  ::vk::checkResult(VVar8,
                    "vk.bindBufferMemory(vkDevice, *indexBuffer, indexAlloc->getMemory(), indexAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x449);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310)
  ;
  pvVar17 = ::vk::Allocation::getHostPtr(pAVar14);
  pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&(this->m_data).super_IndexedParamsBase.indexes,0);
  ::deMemcpy(pvVar17,pvVar18,(ulong)uVar9);
  pVVar5 = pVStack_30;
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310)
  ;
  VVar15 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange(pDVar2,pVVar5,VVar15,VVar16,(ulong)uVar9);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar10;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferCreateInfo.pQueueFamilyIndices);
  (*pDVar2->_vptr_DeviceInterface[0x57])
            (pDVar2,pVVar3,pHVar13->m_internal,0,
             (ulong)(this->m_data).super_IndexedParamsBase.indexType);
  sVar12 = std::
           vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ::size(&(this->m_data).commands);
  if ((sVar12 < 2) || (features.dualSrcBlend != 0)) {
    pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
    ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                           super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar3 = *ppVVar10;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &indirectAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar13->m_internal;
    pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_170);
    VVar16 = ::vk::Allocation::getOffset(pAVar14);
    sVar12 = std::
             vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
             ::size(&(this->m_data).commands);
    (*pDVar2->_vptr_DeviceInterface[0x5c])
              (pDVar2,pVVar3,submitInfo.pSignalSemaphores,VVar16,sVar12 & 0xffffffff,0x14);
  }
  else {
    for (local_37c = 0;
        sVar12 = std::
                 vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                 ::size(&(this->m_data).commands), local_37c < sVar12; local_37c = local_37c + 1) {
      pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                           local_170);
      VVar16 = ::vk::Allocation::getOffset(pAVar14);
      pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
      ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                             super_RefBase<vk::VkCommandBuffer_s_*>);
      pVVar3 = *ppVVar10;
      pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                           &indirectAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
      (*pDVar2->_vptr_DeviceInterface[0x5c])
                (pDVar2,pVVar3,pHVar13->m_internal,(ulong)((int)VVar16 + local_37c * 0x14),1,0x14);
    }
  }
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,*ppVVar10);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar10);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_3d8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                   super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle((Handle<(vk::HandleType)6> *)&refImage.m_data.m_cap,0);
  VVar8 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,queue_00,1,&uStack_3d8,refImage.m_data.m_cap);
  ::vk::checkResult(VVar8,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x46e);
  local_410 = ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_408,&local_410,0x100,0x100,1);
  tcu::TextureLevel::getAccess(&local_438,(TextureLevel *)local_408);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cmd,0.0,0.0,0.0,1.0);
  tcu::clear(&local_438,(Vec4 *)&cmd);
  local_458._M_current =
       (VkDrawIndexedIndirectCommand *)
       std::
       vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
       begin(&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndexedIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
              *)&local_450,&local_458);
  while( true ) {
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                  ::end(&(this->m_data).commands);
    bVar7 = __gnu_cxx::operator!=
                      (&local_450,
                       (__normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                        *)&vertices.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar7) break;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &vertexIndex);
    for (local_494 = 0;
        pVVar19 = __gnu_cxx::
                  __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                  ::operator->(&local_450), local_494 < pVVar19->indexCount;
        local_494 = local_494 + 1) {
      pVVar19 = __gnu_cxx::
                __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                ::operator->(&local_450);
      iVar1 = pVVar19->vertexOffset;
      pVVar19 = __gnu_cxx::
                __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                ::operator->(&local_450);
      pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&(this->m_data).super_IndexedParamsBase.indexes,
                           (ulong)(pVVar19->firstIndex + local_494));
      uVar9 = iVar1 + *pvVar18;
      pvVar20 = std::
                vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ::operator[]((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                              *)&this->m_data,(ulong)uVar9);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar20->position);
      pvVar20 = std::
                vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ::operator[]((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                              *)&this->m_data,(ulong)uVar9);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &vertexIndex,&pvVar20->color);
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&zeroOffset.z,(TextureLevel *)local_408);
    DrawTestInstanceBase::generateRefImage
              (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&zeroOffset.z,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &vertexIndex);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &vertexIndex);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
    ::operator++(&local_450);
  }
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  VVar8 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,queue_00);
  ::vk::checkResult(VVar8,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x482);
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestInstanceBase).m_colorTargetImage);
  allocator_00 = Context::getDefaultAllocator
                           ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  local_500 = zeroOffset.x;
  pvStack_508 = renderedFrame.m_data;
  offset_00.z = zeroOffset.x;
  offset_00._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_4f8,this_02,queue_00,allocator_00,
             VK_IMAGE_LAYOUT_GENERAL,offset_00,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  pDVar2 = vk;
  local_50c = QP_TEST_RESULT_PASS;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_538,(TextureLevel *)local_408);
  bVar7 = imageCompare((TestLog *)pDVar2,&local_538,(ConstPixelBufferAccess *)local_4f8,
                       (this->m_data).super_DrawParamsBase.topology);
  if (((bVar7 ^ 0xffU) & 1) != 0) {
    local_50c = QP_TEST_RESULT_FAIL;
  }
  code = local_50c;
  __s = qpGetTestResultName(local_50c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,__s,&local_559);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_408);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_310);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferCreateInfo.pQueueFamilyIndices);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_170);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawIndexedIndirectParams>::iterate (void)
{
	tcu::TestLog						&log				= m_context.getTestContext().getLog();
	const vk::DeviceInterface&			vk					= m_context.getDeviceInterface();
	const vk::VkDevice					vkDevice			= m_context.getDevice();
	const deUint32						queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const vk::VkQueue					queue				= m_context.getUniversalQueue();
	vk::Allocator&						allocator			= m_context.getDefaultAllocator();
	const vk::VkPhysicalDeviceFeatures	features			= m_context.getDeviceFeatures();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset	= 0;
	const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	vk::Move<vk::VkBuffer>		indirectBuffer;
	de::MovePtr<vk::Allocation>	indirectAlloc;

	{
		const vk::VkDeviceSize	indirectInfoSize	= m_data.commands.size() * sizeof(vk::VkDrawIndexedIndirectCommand);

		const vk::VkBufferCreateInfo	indirectCreateInfo =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			indirectInfoSize,							// VkDeviceSize			size;
			vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT,	// VkBufferUsageFlags	usage;
			vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		indirectBuffer	= createBuffer(vk, vkDevice, &indirectCreateInfo);
		indirectAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indirectBuffer), vk::MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset()));

		deMemcpy(indirectAlloc->getHostPtr(), &(m_data.commands[0]), (size_t)indirectInfoSize);

		vk::flushMappedMemoryRange(m_vk, vkDevice, indirectAlloc->getMemory(), indirectAlloc->getOffset(), indirectInfoSize);
	}

	const deUint32	bufferSize = (deUint32)(m_data.indexes.size() * sizeof(deUint32));

	vk::Move<vk::VkBuffer>			indexBuffer;

	const vk::VkBufferCreateInfo	bufferCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT,		// VkBufferUsageFlags	usage;
		vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyIndexCount;
		&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
	};

	indexBuffer = createBuffer(vk, vkDevice, &bufferCreateInfo);

	de::MovePtr<vk::Allocation>	indexAlloc;

	indexAlloc = allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indexBuffer), vk::MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *indexBuffer, indexAlloc->getMemory(), indexAlloc->getOffset()));

	deMemcpy(indexAlloc->getHostPtr(), &(m_data.indexes[0]), bufferSize);

	vk::flushMappedMemoryRange(m_vk, vkDevice, indexAlloc->getMemory(), indexAlloc->getOffset(), bufferSize);

	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, *indexBuffer, 0u, m_data.indexType);

	// If multiDrawIndirect not supported execute single calls
	if (m_data.commands.size() > 1 && !(features.multiDrawIndirect))
	{
		for (deUint32 cmdIdx = 0; cmdIdx < m_data.commands.size(); ++cmdIdx)
		{
			const deUint32	offset	= (deUint32)(indirectAlloc->getOffset() + cmdIdx * sizeof(vk::VkDrawIndexedIndirectCommand));
			m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, *indirectBuffer, offset, 1, sizeof(vk::VkDrawIndexedIndirectCommand));
		}
	}
	else
	{
		m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, *indirectBuffer, indirectAlloc->getOffset(), (deUint32)m_data.commands.size(), sizeof(vk::VkDrawIndexedIndirectCommand));
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel refImage (vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator cmd = m_data.commands.begin(); cmd != m_data.commands.end(); ++cmd)
	{
		std::vector<tcu::Vec4>	vertices;
		std::vector<tcu::Vec4>	colors;

		for (deUint32 idx = 0; idx < cmd->indexCount; ++idx)
		{
			const deUint32 vertexIndex = cmd->vertexOffset + m_data.indexes[cmd->firstIndex + idx];
			vertices.push_back(m_data.vertices[vertexIndex].position);
			colors.push_back(m_data.vertices[vertexIndex].color);
		}
		generateRefImage(refImage.getAccess(), vertices, colors);
	}

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}